

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O3

void * __thiscall QFontEngine::harfbuzzFont(QFontEngine *this)

{
  hb_font_t *phVar1;
  
  phVar1 = hb_qt_font_get_for_engine(this);
  return phVar1;
}

Assistant:

void *QFontEngine::harfbuzzFont() const
{
    Q_ASSERT(type() != QFontEngine::Multi);
#if QT_CONFIG(harfbuzz)
    return hb_qt_font_get_for_engine(const_cast<QFontEngine *>(this));
#else
    return nullptr;
#endif
}